

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

string * writeCSVFile(string *envName,string *defaultFile,string *dumpDir,string *defaultDir,
                     int index)

{
  pointer pcVar1;
  long lVar2;
  undefined4 in_register_00000084;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar1 = (defaultFile->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + defaultFile->_M_string_length);
  pcVar1 = (dumpDir->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + dumpDir->_M_string_length);
  pcVar1 = (defaultDir->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + defaultDir->_M_string_length);
  lVar2 = *(long *)CONCAT44(in_register_00000084,index);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,lVar2,((long *)CONCAT44(in_register_00000084,index))[1] + lVar2);
  writeFile(envName,&local_b0,&local_50,&local_70,(int)local_90);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return envName;
}

Assistant:

ofstream writeCSVFile(string envName, string defaultFile,string dumpDir,string defaultDir, int index){
    return writeFile(envName, defaultFile, dumpDir, defaultDir, index);
}